

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O3

void __thiscall libchars::edit_object::swap(edit_object *this)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->insert_idx;
  if ((uVar2 != 0) && (uVar3 = this->buflen, 1 < uVar3 && uVar2 <= uVar3)) {
    pcVar1 = this->buffer + ~(ulong)(uVar2 == uVar3) + uVar2;
    *(ushort *)pcVar1 = *(ushort *)pcVar1 << 8 | *(ushort *)pcVar1 >> 8;
    if (this->insert_idx < this->buflen) {
      (*this->_vptr_edit_object[10])(this,1);
      return;
    }
  }
  return;
}

Assistant:

virtual void swap()
        {
            if (insert_idx > 0 && insert_idx <= buflen && buflen > 1) {
                size_t swap_idx = insert_idx;
                if (swap_idx == buflen)
                    --swap_idx;
                char c = *(buffer + swap_idx);
                *(buffer + swap_idx) = *(buffer + swap_idx - 1);
                *(buffer + swap_idx - 1) = c;
                if (insert_idx < buflen)
                    right();
            }
        }